

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  double dVar2;
  float fVar3;
  int iVar4;
  GLuint GVar5;
  GLuint shader;
  GLuint program;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  ostream *poVar11;
  const_iterator __cbeg;
  iterator __first;
  int iVar12;
  int *piVar13;
  tmat4x4<float> *m1;
  char *pcVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  int width;
  float rotation_1;
  int height;
  float rotation;
  GLuint vao;
  GLuint cubemap;
  int local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  GLuint local_184;
  float local_180;
  int local_17c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_178;
  undefined1 local_168 [16];
  long local_150;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_148;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [12];
  col_type cStack_fc;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 aStack_e8;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 aStack_d8;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_c8;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 local_8c;
  undefined4 local_80;
  undefined4 local_7c;
  value_type local_78 [18];
  
  iVar4 = glfwInit();
  if (iVar4 == 0) {
    pcVar14 = "Failed to init GLFW";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GLFW Successfully Started",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    glfwSetErrorCallback(glfw_error_callback);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,0);
    local_150 = glfwCreateWindow(0x280,0x1e0,"Stupid SH Tricks",0,0);
    if (local_150 != 0) {
      iVar4 = 0x110bbc;
      glfwSetKeyCallback(local_150);
      glfwMakeContextCurrent(local_150);
      glewInit();
      glfwSwapInterval(1);
      _check_gl_error((char *)0x1a0,iVar4);
      iVar4 = (int)&local_80;
      (*__glewGenVertexArrays)(1);
      (*__glewBindVertexArray)(local_80);
      _check_gl_error((char *)0x1a5,iVar4);
      (*__glewGenBuffers)(1,&sphere_buffer);
      GVar5 = sphere_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateSpherePositions();
      _check_gl_error((char *)0x1aa,GVar5);
      (*__glewGenBuffers)(1,&vertex_buffer);
      GVar5 = vertex_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateBuffer();
      _check_gl_error((char *)0x1af,GVar5);
      (*__glewGenBuffers)(1,&legendre_buffer);
      GVar5 = legendre_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateSHBuffer();
      _check_gl_error((char *)0x1b4,GVar5);
      (*__glewGenBuffers)(1,&index_buffer);
      GVar5 = index_buffer;
      (*__glewBindBuffer)(0x8893);
      regenerateIndices();
      _check_gl_error((char *)0x1b9,GVar5);
      glGenTextures(1,&local_7c);
      (*__glewActiveTexture)(0x84c0);
      glBindTexture(0xde1,local_7c);
      loadCubemap("assets/ToTheMoonRocket.jpg");
      GVar5 = (*__glewCreateShader)(0x8b31);
      iVar4 = 1;
      (*__glewShaderSource)(GVar5,1,&vertex_shader_text,0);
      (*__glewCompileShader)(GVar5);
      _check_gl_error((char *)0x1c3,iVar4);
      checkShaderError(GVar5);
      shader = (*__glewCreateShader)(0x8b30);
      iVar4 = 1;
      (*__glewShaderSource)(shader,1,&fragment_shader_text,0);
      (*__glewCompileShader)(shader);
      _check_gl_error((char *)0x1c9,iVar4);
      checkShaderError(shader);
      program = (*__glewCreateProgram)();
      (*__glewAttachShader)(program,GVar5);
      (*__glewAttachShader)(program);
      (*__glewLinkProgram)(program);
      (*__glewValidateProgram)(program);
      checkLinkError(program);
      _check_gl_error((char *)0x1d2,shader);
      local_188 = (*__glewGetUniformLocation)(program,"MVP");
      uVar6 = (*__glewGetUniformLocation)(program,"scale");
      local_18c = (*__glewGetUniformLocation)(program,"textured");
      uVar7 = (*__glewGetAttribLocation)(program,"vPos");
      iVar4 = 0x15d332;
      local_184 = program;
      uVar8 = (*__glewGetAttribLocation)(program);
      _check_gl_error((char *)0x1da,iVar4);
      glClearColor(0x3e4ccccd,0x3e4ccccd,0x3e4ccccd,0x3f800000);
      glEnable(0xb71);
      GVar5 = sphere_buffer;
      (*__glewBindBuffer)(0x8892);
      _check_gl_error((char *)0x1e2,GVar5);
      (*__glewEnableVertexAttribArray)(uVar7);
      _check_gl_error((char *)0x1e4,GVar5);
      lVar16 = local_150;
      iVar4 = 3;
      (*__glewVertexAttribPointer)(uVar7,3,0x1406,0,0xc,0);
      _check_gl_error((char *)0x1e6,iVar4);
      local_190 = uVar8;
      (*__glewEnableVertexAttribArray)(uVar8);
      _check_gl_error((char *)0x1ea,iVar4);
      glfwGetTime();
      iVar4 = glfwWindowShouldClose(lVar16);
      while (iVar4 == 0) {
        local_c8.field_0.x = 1.0;
        local_c8.field_0.y = 0.0;
        local_c8.field_0.z = 0.0;
        local_c8.field_0.w = 0.0;
        uStack_b8 = 0;
        uStack_b4 = 0x3f800000;
        uStack_b0 = 0;
        uStack_a8 = 0;
        local_a0 = 0x3f800000;
        local_9c = 0;
        uStack_98 = 0;
        uStack_94 = 0;
        uStack_90 = 0;
        local_8c = 0x3f800000;
        local_108._0_4_ = 1.0;
        local_108._4_8_ = 0;
        cStack_fc.field_0._0_8_ = 0;
        cStack_fc.field_0.field_0.z = 1.0;
        stack0xffffffffffffff10 = 0;
        aStack_e8._0_8_ = 0;
        aStack_e8.field_0.z = 1.0;
        aStack_e8.field_0.w = 0.0;
        aStack_d8.field_0.x = 0.0;
        aStack_d8.field_0.y = 0.0;
        aStack_d8.field_0.z = 0.0;
        aStack_d8.field_0.w = 1.0;
        local_78[0] = 1.0;
        local_78[1] = 0.0;
        local_78[2] = 0.0;
        local_78[3] = 0.0;
        local_78[4] = 0.0;
        local_78[5] = 1.0;
        local_78[6] = 0.0;
        local_78[7] = 0.0;
        local_78[8] = 0.0;
        local_78[9] = 0.0;
        local_78[10] = 1.0;
        local_78[0xb] = 0.0;
        local_78[0xc] = 0.0;
        local_78[0xd] = 0.0;
        local_78[0xe] = 0.0;
        local_78[0xf] = 1.0;
        piVar13 = &local_194;
        glfwGetFramebufferSize(lVar16,piVar13,&local_17c);
        _check_gl_error((char *)0x1f8,(int)piVar13);
        iVar15 = local_17c;
        iVar4 = local_194;
        iVar12 = 0;
        glViewport(0,0,local_194,local_17c);
        _check_gl_error((char *)0x1fc,iVar12);
        glClear(0x4100);
        _check_gl_error((char *)0x1fe,iVar12);
        dVar2 = (double)glfwGetTime();
        uVar9 = (int)((ulong)((long)rotations.
                                    super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1;
        if (-1 < (int)uVar9) {
          fVar19 = (float)dVar2;
          uVar18 = (ulong)uVar9 << 4 | 4;
          uVar10 = 0;
          local_168._0_4_ = fVar19;
          __first._M_current =
               rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
               super__Vector_impl_data._M_start;
          lVar16 = (ulong)uVar9 + 1;
          do {
            fVar3 = ((fVar19 - *(float *)((long)__first._M_current + (uVar18 - 4))) * 180.0) /
                    3.1415927;
            local_178.field_0.x = fVar3;
            if (fVar3 < 360.0) {
              glm::rotate<float>((tmat4x4<float> *)&local_148.field_0,
                                 (tmat4x4<float> *)&local_c8.field_0,(float *)&local_178,
                                 (tvec3<float> *)((long)&(__first._M_current)->startTime + uVar18));
              uStack_b0 = CONCAT44(uStack_12c,uStack_130);
              uStack_a8 = CONCAT44(uStack_124,local_128);
              local_c8.field_0.x = local_148.field_0.x;
              local_c8.field_0.y = local_148.field_0.y;
              local_c8.field_0.z = local_148.field_0.z;
              local_c8.field_0.w = local_148.field_0.w;
              uStack_b8 = local_138;
              uStack_b4 = uStack_134;
              local_a0 = uStack_120;
              local_9c = uStack_11c;
              uStack_98 = local_118;
              uStack_94 = uStack_114;
              uStack_90 = uStack_110;
              local_8c = uStack_10c;
              uVar10 = (int)lVar16 - 1;
              __first._M_current =
                   rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
                   super__Vector_impl_data._M_start;
              fVar19 = (float)local_168._0_4_;
            }
            uVar18 = uVar18 - 0x10;
            lVar17 = lVar16 + -1;
            bVar1 = 0 < lVar16;
            lVar16 = lVar17;
          } while (lVar17 != 0 && bVar1);
          if (0 < (int)uVar10) {
            std::vector<Rotation,_std::allocator<Rotation>_>::_M_erase
                      (&rotations,__first,__first._M_current + uVar10);
          }
        }
        iVar12 = iVar15 / 5;
        fVar19 = (float)iVar4;
        if (0 < antiRotationFrames) {
          local_168 = ZEXT416((uint)(float)iVar4);
          local_180 = ((float)antiRotationFrames * 360.0) / (float)theta_n;
          local_178._0_8_ = 0xbf80000000000000;
          local_178.field_0.z = 0.0;
          glm::rotate<float>((tmat4x4<float> *)&local_148.field_0,
                             (tmat4x4<float> *)&local_c8.field_0,&local_180,
                             (tvec3<float> *)&local_178.field_0);
          uStack_b0 = CONCAT44(uStack_12c,uStack_130);
          uStack_a8 = CONCAT44(uStack_124,local_128);
          local_c8.field_0.x = local_148.field_0.x;
          local_c8.field_0.y = local_148.field_0.y;
          local_c8.field_0.z = local_148.field_0.z;
          local_c8.field_0.w = local_148.field_0.w;
          uStack_b8 = local_138;
          uStack_b4 = uStack_134;
          local_a0 = uStack_120;
          local_9c = uStack_11c;
          uStack_98 = local_118;
          uStack_94 = uStack_114;
          uStack_90 = uStack_110;
          local_8c = uStack_10c;
          fVar19 = (float)local_168._0_4_;
        }
        fVar19 = fVar19 / (float)iVar15;
        local_108._0_4_ = 2.0 / (fVar19 + fVar19);
        aStack_d8.field_0.x = -(fVar19 - fVar19) / (fVar19 + fVar19);
        local_108._4_8_ = 0;
        cStack_fc.field_0._0_8_ = 0;
        cStack_fc.field_0.field_0.z = 1.0;
        stack0xffffffffffffff10 = 0;
        aStack_e8._0_8_ = 0;
        aStack_e8.field_0.z = 0.1;
        aStack_e8.field_0.w = 0.0;
        aStack_d8.field_0.y = -0.0;
        aStack_d8.field_0.z = 0.0;
        aStack_d8.field_0.w = 1.0;
        m1 = (tmat4x4<float> *)local_108;
        glm::detail::operator*(m1,(tmat4x4<float> *)&local_c8.field_0);
        iVar4 = (int)m1;
        local_78[0] = local_148.field_0.x;
        local_78[5] = (value_type)uStack_134;
        local_78[10] = (value_type)uStack_120;
        local_78[0xf] = (value_type)uStack_10c;
        (*__glewUseProgram)(local_184);
        _check_gl_error((char *)0x21a,iVar4);
        uVar8 = local_188;
        (*__glewUniformMatrix4fv)(local_188,1,0,local_78);
        (*__glewUniform1f)(0x3f800000,uVar6);
        uVar9 = (uint)textured;
        (*__glewUniform1i)(local_18c);
        _check_gl_error((char *)0x21e,uVar9);
        GVar5 = vertex_buffer;
        (*__glewBindBuffer)(0x8892);
        _check_gl_error((char *)0x222,GVar5);
        uVar7 = local_190;
        iVar4 = 1;
        (*__glewVertexAttribPointer)(local_190,1,0x1406,0,4,0);
        _check_gl_error((char *)0x224,iVar4);
        glDrawElements(4,(int)index_count,0x1405,0);
        local_108._0_4_ = 2.0;
        local_108._4_8_ = 0;
        cStack_fc.field_0._0_8_ = 0;
        cStack_fc.field_0.field_0.z = 2.0;
        stack0xffffffffffffff10 = 0;
        aStack_e8._0_8_ = 0;
        aStack_e8.field_0.z = 0.1;
        aStack_e8.field_0.w = 0.0;
        aStack_d8.field_0.x = -0.0;
        aStack_d8.field_0.y = -0.0;
        aStack_d8.field_0.z = 0.0;
        aStack_d8.field_0.w = 1.0;
        glm::detail::operator*((tmat4x4<float> *)local_108,(tmat4x4<float> *)&local_c8.field_0);
        local_78[0] = local_148.field_0.x;
        local_78[5] = (value_type)uStack_134;
        local_78[10] = (value_type)uStack_120;
        local_78[0xf] = (value_type)uStack_10c;
        iVar4 = 1;
        (*__glewUniformMatrix4fv)(uVar8,1,0,local_78);
        _check_gl_error((char *)0x232,iVar4);
        GVar5 = legendre_buffer;
        (*__glewBindBuffer)(0x8892);
        _check_gl_error((char *)0x235,GVar5);
        glClear(0x100);
        glViewport(0,iVar12 * 4,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[0],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,0);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x241,iVar4);
        local_168._0_4_ = iVar12 * 2;
        glViewport(0,iVar12 * 2,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[1],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count << 2);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x247,iVar4);
        glViewport(0,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[2],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count << 3);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x24d,iVar4);
        glViewport(0,0,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[3],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0xc);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x253,iVar4);
        iVar15 = local_194 - iVar12;
        glViewport(iVar15,iVar12 * 4,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[4],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count << 4);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x25f,iVar4);
        glViewport(iVar15,iVar12 * 3,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[5],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0x14);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x265,iVar4);
        glViewport(iVar15,local_168._0_4_,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[6],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0x18);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x26b,iVar4);
        glViewport(iVar15,iVar12,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[7],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0x1c);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x271,iVar4);
        glViewport(iVar15,0,iVar12);
        (*__glewUniform1f)(legendre_params[8],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x277,iVar4);
        lVar16 = local_150;
        glfwSwapBuffers(local_150);
        _check_gl_error((char *)0x27d,iVar4);
        glfwPollEvents();
        _check_gl_error((char *)0x282,iVar4);
        if (0 < rotationFrames) {
          rotateParams();
          rotationFrames = rotationFrames + -1;
        }
        if (0 < antiRotationFrames) {
          antiRotationFrames = antiRotationFrames + -1;
        }
        glfwGetTime();
        iVar4 = glfwWindowShouldClose(lVar16);
      }
      return 0;
    }
    pcVar14 = "Failed to create window";
  }
  poVar11 = std::operator<<((ostream *)&std::cout,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar11);
  exit(-1);
}

Assistant:

int main() {
    if (!glfwInit()) {
        cout << "Failed to init GLFW" << endl;
        exit(-1);
    }
    cout << "GLFW Successfully Started" << endl;

    glfwSetErrorCallback(glfw_error_callback);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
#ifdef APPLE
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#endif
    GLFWwindow* window = glfwCreateWindow(640, 480, "Stupid SH Tricks", NULL, NULL);
    if (!window) {
        cout << "Failed to create window" << endl;
        exit(-1);
    }
    glfwSetKeyCallback(window, glfw_key_callback);

    glfwMakeContextCurrent(window);
    glewInit();

    glfwSwapInterval(1);

    GLuint vertex_shader, fragment_shader, program;
    GLuint mvp_location, vpos_location, vscale_location, scale_location, textured_location;
    GLuint cubemap;

    initPerformanceData();

    checkError();

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);
    checkError();

    glGenBuffers(1, &sphere_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    regenerateSpherePositions();
    checkError();

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    regenerateBuffer();
    checkError();

    glGenBuffers(1, &legendre_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
    regenerateSHBuffer();
    checkError();

    glGenBuffers(1, &index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, index_buffer);
    regenerateIndices();
    checkError();

    glGenTextures(1, &cubemap);
    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, cubemap);
    loadCubemap("assets/ToTheMoonRocket.jpg");

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);
    checkError();
    checkShaderError(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);
    checkError();
    checkShaderError(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);
    glValidateProgram(program);
    checkLinkError(program);
    checkError();


    mvp_location = glGetUniformLocation(program, "MVP");
    scale_location = glGetUniformLocation(program, "scale");
    textured_location = glGetUniformLocation(program, "textured");
    vpos_location = glGetAttribLocation(program, "vPos");
    vscale_location = glGetAttribLocation(program, "vScale");
    checkError();

    glClearColor(0.2f, 0.2f, 0.2f, 1.0f);

    glEnable(GL_DEPTH_TEST);

    // We'll always use the sphere_buffer for vPos
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    checkError();
    glEnableVertexAttribArray(vpos_location);
    checkError();
    glVertexAttribPointer(vpos_location, 3, GL_FLOAT, GL_FALSE, sizeof(vec3), 0);
    checkError();

    // We're going to use an attrib array for vScale, but it will be set up later.
    glEnableVertexAttribArray(vscale_location);
    checkError();

    // make sure performance data is clean going into main loop
    markPerformanceFrame();
    printPerformanceData();
    double lastPerfPrintTime = glfwGetTime();
    while (!glfwWindowShouldClose(window)) {
        float ratio;
        int width, height, viewportSize;
        mat4 m, p, mvp;

        {
            Perf stat("Setup frame and clear buffers");
            glfwGetFramebufferSize(window, &width, &height);
            checkError();
            ratio = width / (float) height;
            viewportSize = height / 5;
            glViewport(0, 0, width, height);
            checkError();
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            checkError();

            float now = float(glfwGetTime());
            int lastValid = 0;
            for (int c = rotations.size()-1; c >= 0; c--) {
                Rotation &rot = rotations[c];
                float rotation = float((now - rot.startTime) * 180 / M_PI);
                if (rotation < 360) {
                    m = rotate(m, rotation, rot.axis);
                    lastValid = c;
                }
            }
            if (lastValid > 0) {
                rotations.erase(rotations.begin(), rotations.begin() + lastValid);
            }

            if (antiRotationFrames > 0) {
                float rotation = antiRotationFrames * 360.f / theta_n;
                m = rotate(m, rotation, vec3(0,-1,0));
            }
        }

        {
            Perf stat("Setup vertex pointers for first draw");
            p = ortho(-ratio, ratio, -1.f, 1.f, 10.f, -10.f);
            mvp = p * m;

            glUseProgram(program);
            checkError();
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            glUniform1f(scale_location, 1.f);
            glUniform1i(textured_location, textured);
            checkError();

            // draw the base buffer
            glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
            checkError();
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), 0);
            checkError();
        }
        {
            Perf stat("Draw base shape");
            // glDrawArrays(GL_POINTS, 0, vertex_count);
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
        }

        // draw the components
        {
            Perf stat("Setup unforms and vertex arrays for components");
            p = ortho(-0.5f, 0.5f, -0.5f, 0.5f, 10.f, -10.f);
            mvp = p * m;
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            checkError();

            glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
            checkError();

            glClear(GL_DEPTH_BUFFER_BIT); // always draw components on top of base shape. Depth test still necessary since triangles are unordered
        }

        {
            Perf stat("Draw left side");
            // left side
            glViewport(0, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[0]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (0 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[1]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (1 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[2]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (2 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[3]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (3 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Draw right side");
            // right side
            int right = width - viewportSize;

            glViewport(right, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[4]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (4 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 3 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[5]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (5 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[6]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (6 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[7]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (7 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[8]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (8 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Swap buffers");
            glfwSwapBuffers(window);
            checkError();
        }
        {
            Perf stat("Poll events");
            glfwPollEvents();
            checkError();
        }

        if (rotationFrames > 0) {
            rotateParams();
            rotationFrames--;
        }
        if (antiRotationFrames > 0) {
            antiRotationFrames--;
        }

        markPerformanceFrame();

        double now = glfwGetTime();
        if (now - lastPerfPrintTime > 10.0) {
            printPerformanceData();
            lastPerfPrintTime = now;
        }
    }

    return 0;
}